

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestPackage.cpp
# Opt level: O2

void __thiscall tcu::TestPackageRegistry::~TestPackageRegistry(TestPackageRegistry *this)

{
  pointer ppPVar1;
  PackageInfo *this_00;
  int i;
  long lVar2;
  
  for (lVar2 = 0;
      ppPVar1 = (this->m_packageInfos).
                super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(this->m_packageInfos).
                                  super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1) >> 3);
      lVar2 = lVar2 + 1) {
    this_00 = ppPVar1[lVar2];
    if (this_00 != (PackageInfo *)0x0) {
      std::__cxx11::string::~string((string *)this_00);
    }
    operator_delete(this_00,0x28);
  }
  std::
  _Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
  ::~_Vector_base((_Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
                   *)this);
  return;
}

Assistant:

TestPackageRegistry::~TestPackageRegistry (void)
{
	for (int i = 0; i < (int)m_packageInfos.size(); i++)
		delete m_packageInfos[i];
}